

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyMemcmp(void *pB1,void *pB2,sxu32 nSize)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  
  if (nSize == 0) {
    return 0;
  }
  if (pB2 == (void *)0x0 || pB1 == (void *)0x0) {
    iVar2 = 1;
    if (pB1 == (void *)0x0) {
      iVar2 = -(uint)(pB2 != (void *)0x0);
    }
    return iVar2;
  }
  lVar5 = 0;
  pvVar3 = pB2;
  pbVar6 = (byte *)pB1;
  do {
    if (*(char *)((long)pB1 + lVar5) != *(char *)((long)pB2 + lVar5)) {
      bVar1 = false;
      pbVar4 = pbVar6;
      break;
    }
    bVar1 = true;
    iVar2 = (int)lVar5;
    if (nSize - 1 == iVar2) {
      pbVar4 = pbVar6 + 1;
      pbVar6 = (byte *)((long)pvVar3 + 1);
      goto LAB_00110297;
    }
    if (*(char *)((long)pB1 + lVar5 + 1) != *(char *)((long)pB2 + lVar5 + 1)) {
      pbVar6 = (byte *)((long)pB2 + lVar5 + 1);
      pbVar4 = (byte *)((long)pB1 + lVar5 + 1);
LAB_00110295:
      bVar1 = false;
      goto LAB_00110297;
    }
    pbVar4 = pbVar6 + 2;
    if (nSize - 2 == iVar2) {
      pbVar6 = (byte *)((long)pB2 + lVar5 + 2);
      goto LAB_00110297;
    }
    if (*(char *)((long)pB1 + lVar5 + 2) != *(char *)((long)pB2 + lVar5 + 2)) {
      pbVar6 = (byte *)((long)pvVar3 + 2);
      goto LAB_00110295;
    }
    pbVar4 = pbVar6 + 3;
    if (nSize - 3 == iVar2) {
      pbVar6 = (byte *)((long)pvVar3 + 3);
      goto LAB_00110297;
    }
    if (*(char *)((long)pB1 + lVar5 + 3) != *(char *)((long)pB2 + lVar5 + 3)) {
      pbVar6 = (byte *)((long)pB2 + lVar5 + 3);
      goto LAB_00110295;
    }
    pbVar6 = pbVar6 + 4;
    pvVar3 = (void *)((long)pvVar3 + 4);
    lVar5 = lVar5 + 4;
    pbVar4 = pbVar6;
  } while (nSize != (sxu32)lVar5);
  pbVar6 = (byte *)((long)pB2 + lVar5);
LAB_00110297:
  if (bVar1) {
    iVar2 = 0;
  }
  else {
    iVar2 = (uint)*pbVar4 - (uint)*pbVar6;
  }
  return iVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyMemcmp(const void *pB1, const void *pB2, sxu32 nSize)
{
	sxi32 rc;
	if( nSize <= 0 ){
		return 0;
	}
	if( pB1 == 0 || pB2 == 0 ){
		return pB1 != 0 ? 1 : (pB2 == 0 ? 0 : -1);
	}
	SX_MACRO_FAST_CMP(pB1, pB2, nSize, rc);
	return rc;
}